

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamWriter::writeAttribute
          (QXmlStreamWriter *this,QAnyStringView namespaceUri,QAnyStringView name,
          QAnyStringView value)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  NamespaceDeclaration *this_01;
  void *pvVar1;
  const_pointer pvVar2;
  ulong uVar3;
  size_t sVar4;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>
       .super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl;
  sVar4 = 1;
  this_01 = QXmlStreamWriterPrivate::findNamespace(this_00._M_head_impl,namespaceUri,true,true);
  pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x45505b);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x45505b,pvVar1,sVar4);
  if ((this_01->prefix).m_size != 0) {
    pvVar2 = QtPrivate::XmlStringRef::data(&this_01->prefix);
    uVar3 = QtPrivate::XmlStringRef::size(&this_01->prefix);
    QXmlStreamWriterPrivate::write
              (this_00._M_head_impl,(int)pvVar2,(void *)(uVar3 | 0x8000000000000000),sVar4);
    pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x47339c);
    QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x47339c,pvVar1,sVar4);
  }
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,name.field_0._0_4_,(void *)name.m_size,sVar4);
  pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,3ul>((char (*) [3])0x4683ff);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x4683ff,pvVar1,sVar4);
  sVar4 = 1;
  QXmlStreamWriterPrivate::writeEscaped(this_00._M_head_impl,value,true);
  pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x466b4f);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x466b4f,pvVar1,sVar4);
  (this_00._M_head_impl)->field_0x79 = (this_00._M_head_impl)->field_0x79 | 2;
  return;
}

Assistant:

void QXmlStreamWriter::writeAttribute(QAnyStringView namespaceUri, QAnyStringView name, QAnyStringView value)
{
    Q_D(QXmlStreamWriter);
    Q_ASSERT(d->inStartElement);
    Q_ASSERT(!contains(name, ':'));
    QXmlStreamWriterPrivate::NamespaceDeclaration &namespaceDeclaration = d->findNamespace(namespaceUri, true, true);
    d->write(" ");
    if (!namespaceDeclaration.prefix.isEmpty()) {
        d->write(namespaceDeclaration.prefix);
        d->write(":");
    }
    d->write(name);
    d->write("=\"");
    d->writeEscaped(value, true);
    d->write("\"");
    d->didWriteAnyToken = true;
}